

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dasm_x86.h
# Opt level: O2

void dasm_init(BuildCtx *ctx,int maxsection)

{
  dasm_State *pdVar1;
  dasm_Section *pdVar2;
  ulong uVar3;
  ulong uVar4;
  
  ctx->D = (dasm_State *)0x0;
  uVar4 = 0x10;
  do {
    uVar3 = uVar4;
    uVar4 = uVar3 * 2;
  } while (uVar3 < (long)(maxsection + -1) * 0x28 + 0x78U);
  pdVar1 = (dasm_State *)malloc(uVar3);
  ctx->D = pdVar1;
  if (pdVar1 != (dasm_State *)0x0) {
    pdVar1->psize = uVar3;
    pdVar1->lglabels = (int *)0x0;
    pdVar1->lgsize = 0;
    pdVar1->globals = (void **)0x0;
    pdVar1->pclabels = (int *)0x0;
    pdVar1->pcsize = 0;
    pdVar1->maxsection = maxsection;
    pdVar2 = pdVar1->sections;
    uVar3 = 0;
    uVar4 = (ulong)(uint)maxsection;
    if (maxsection < 1) {
      uVar4 = uVar3;
    }
    for (; uVar4 * 0x1000000 != uVar3; uVar3 = uVar3 + 0x1000000) {
      pdVar2->buf = (int *)0x0;
      pdVar2->bsize = 0;
      pdVar2->rbuf = (int *)((long)(int)uVar3 * -4);
      pdVar2->epos = 0;
      pdVar2 = pdVar2 + 1;
    }
    return;
  }
  exit(1);
}

Assistant:

void dasm_init(Dst_DECL, int maxsection)
{
  dasm_State *D;
  size_t psz = 0;
  int i;
  Dst_REF = NULL;
  DASM_M_GROW(Dst, struct dasm_State, Dst_REF, psz, DASM_PSZ(maxsection));
  D = Dst_REF;
  D->psize = psz;
  D->lglabels = NULL;
  D->lgsize = 0;
  D->pclabels = NULL;
  D->pcsize = 0;
  D->globals = NULL;
  D->maxsection = maxsection;
  for (i = 0; i < maxsection; i++) {
    D->sections[i].buf = NULL;  /* Need this for pass3. */
    D->sections[i].rbuf = D->sections[i].buf - DASM_SEC2POS(i);
    D->sections[i].bsize = 0;
    D->sections[i].epos = 0;  /* Wrong, but is recalculated after resize. */
  }
}